

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O1

Vec_Int_t * Gia_ManFindLatest(Gia_Man_t *p,int LevelMax,int nTimeWindow)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  void *__ptr;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_00->pArray = piVar7;
  pVVar8 = p->vMapping;
  if (pVVar8 == (Vec_Int_t *)0x0) {
    uVar6 = Gia_ManLevelNum(p);
    if (nTimeWindow != 0) {
      LevelMax = (int)((double)(int)uVar6 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar6 < LevelMax) {
      printf("The maximum AIG level (%d) is less than the target level (%d).\n",(ulong)uVar6,
             (ulong)(uint)LevelMax);
    }
    pVVar8 = p->vCos;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        uVar6 = pVVar8->pArray[lVar15];
        if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_00703d92;
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return p_00;
        }
        pVVar8 = p->vLevels;
        if (pVVar8->nSize <= (int)uVar6) {
          lVar2 = (ulong)uVar6 + 1;
          iVar4 = pVVar8->nCap;
          lVar5 = (long)iVar4 * 2;
          if ((int)uVar6 < (int)lVar5) {
            if (iVar4 < (int)lVar5 && iVar4 <= (int)uVar6) {
              sVar16 = (long)iVar4 << 3;
              if (pVVar8->pArray == (int *)0x0) {
                piVar7 = (int *)malloc(sVar16);
              }
              else {
                piVar7 = (int *)realloc(pVVar8->pArray,sVar16);
              }
              pVVar8->pArray = piVar7;
joined_r0x00703cf2:
              if (piVar7 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar8->nCap = (int)lVar5;
            }
          }
          else if (iVar4 <= (int)uVar6) {
            if (pVVar8->pArray == (int *)0x0) {
              piVar7 = (int *)malloc(lVar2 * 4);
            }
            else {
              piVar7 = (int *)realloc(pVVar8->pArray,lVar2 * 4);
            }
            pVVar8->pArray = piVar7;
            lVar5 = lVar2;
            goto joined_r0x00703cf2;
          }
          iVar4 = pVVar8->nSize;
          if (iVar4 <= (int)uVar6) {
            memset(pVVar8->pArray + iVar4,0,(ulong)(uVar6 - iVar4) * 4 + 4);
          }
          pVVar8->nSize = (int)lVar2;
        }
        if (pVVar8->nSize <= (int)uVar6) goto LAB_00703d73;
        if (LevelMax <= pVVar8->pArray[uVar6]) {
          Vec_IntPush(p_00,(int)lVar15);
        }
        lVar15 = lVar15 + 1;
        pVVar8 = p->vCos;
      } while (lVar15 < pVVar8->nSize);
    }
  }
  else {
    sVar16 = (size_t)p->nObjs;
    __ptr = calloc(sVar16,4);
    uVar11 = 0;
    if (1 < (long)sVar16) {
      uVar6 = pVVar8->nSize;
      uVar9 = 1;
      if (1 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
      }
      uVar12 = 1;
      uVar11 = 0;
      do {
        if (uVar12 == uVar9) {
LAB_00703d73:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = pVVar8->pArray[uVar12];
        if ((ulong)uVar13 != 0) {
          if ((int)uVar6 <= (int)uVar13 || (int)uVar13 < 0) goto LAB_00703d73;
          puVar1 = (uint *)(pVVar8->pArray + uVar13);
          uVar3 = *puVar1;
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          uVar14 = 0;
          while (uVar3 != uVar14) {
            iVar4 = *(int *)((long)__ptr + uVar12 * 4);
            iVar10 = *(int *)((long)__ptr + (long)(int)puVar1[uVar14 + 1] * 4);
            if (iVar10 < iVar4) {
              iVar10 = iVar4;
            }
            *(int *)((long)__ptr + uVar12 * 4) = iVar10;
            uVar14 = uVar14 + 1;
            if ((int)uVar6 <= (int)uVar13 || (int)uVar13 < 0) goto LAB_00703d73;
          }
          uVar13 = *(int *)((long)__ptr + uVar12 * 4) + 1;
          *(uint *)((long)__ptr + uVar12 * 4) = uVar13;
          if ((int)uVar11 <= (int)uVar13) {
            uVar11 = (ulong)uVar13;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != sVar16);
    }
    if (nTimeWindow != 0) {
      LevelMax = (int)((double)(int)uVar11 * ((double)nTimeWindow * -0.01 + 1.0));
    }
    if ((int)uVar11 < LevelMax) {
      printf("The maximum mapped level (%d) is less than the target level (%d).\n",uVar11,
             (ulong)(uint)LevelMax);
    }
    pVVar8 = p->vCos;
    if (0 < pVVar8->nSize) {
      lVar15 = 0;
      do {
        iVar4 = pVVar8->pArray[lVar15];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00703d92:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (LevelMax <=
            *(int *)((long)__ptr +
                    (long)(int)(iVar4 - (*(uint *)(p->pObjs + iVar4) & 0x1fffffff)) * 4)) {
          Vec_IntPush(p_00,(int)lVar15);
        }
        lVar15 = lVar15 + 1;
        pVVar8 = p->vCos;
      } while (lVar15 < pVVar8->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManFindLatest( Gia_Man_t * p, int LevelMax, int nTimeWindow )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    vOuts = Vec_IntAlloc( 1000 );
    if ( Gia_ManHasMapping(p) )
    {
        int i, k, iFan, nLevels = 0;
        int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            Gia_LutForEachFanin( p, i, iFan, k )
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
            pLevels[i]++;
            nLevels = Abc_MaxInt( nLevels, pLevels[i] );
        }
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum mapped level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( pLevels[Gia_ObjFaninId0p(p, pObj)] >= LevelMax )
                Vec_IntPush( vOuts, i );
        ABC_FREE( pLevels );
    }
    else
    {
        int i, nLevels = Gia_ManLevelNum( p );
        if ( nTimeWindow )
            LevelMax = (int)((1.0 - 0.01 * nTimeWindow) * nLevels);
        if ( nLevels < LevelMax )
            printf( "The maximum AIG level (%d) is less than the target level (%d).\n", nLevels, LevelMax );
        Gia_ManForEachCo( p, pObj, i )
            if ( Gia_ObjLevel(p, pObj) >= LevelMax )
                Vec_IntPush( vOuts, i );
    }
    return vOuts;
}